

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DecPOMDPDiscrete.cpp
# Opt level: O2

void __thiscall DecPOMDPDiscrete::CreateNewRewardModel(DecPOMDPDiscrete *this)

{
  CreateNewRewardModel
            ((DecPOMDPDiscrete *)
             (&(this->super_MultiAgentDecisionProcessDiscrete).super_MultiAgentDecisionProcess.
               field_0x0 +
             *(long *)(*(long *)&(this->super_MultiAgentDecisionProcessDiscrete).
                                 super_MultiAgentDecisionProcess + -0xc0)));
  return;
}

Assistant:

void DecPOMDPDiscrete::CreateNewRewardModel()
{
    if(_m_initialized)
    delete(_m_p_rModel);

    if(GetSparse())
        _m_p_rModel = new RewardModelMappingSparse( GetNrStates(), GetNrJointActions());
    else
        _m_p_rModel = new RewardModelMapping( GetNrStates(), GetNrJointActions());
}